

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall google::protobuf::FileDescriptorProto::IsInitialized(FileDescriptorProto *this)

{
  uint uVar1;
  FileOptions *pFVar2;
  bool bVar3;
  LogMessage *other;
  LogMessage local_60;
  LogFinisher local_21;
  
  bVar3 = internal::AllAreInitialized<google::protobuf::DescriptorProto>(&this->message_type_);
  if ((((!bVar3) ||
       (bVar3 = internal::AllAreInitialized<google::protobuf::EnumDescriptorProto>
                          (&this->enum_type_), !bVar3)) ||
      (bVar3 = internal::AllAreInitialized<google::protobuf::ServiceDescriptorProto>
                         (&this->service_), !bVar3)) ||
     (bVar3 = internal::AllAreInitialized<google::protobuf::FieldDescriptorProto>(&this->extension_)
     , !bVar3)) {
    return false;
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if (((uVar1 & 8) != 0) && (this->options_ == (FileOptions *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/descriptor.pb.h"
               ,0x1d1e);
    other = internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: !value || options_ != nullptr: ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if ((uVar1 & 8) != 0) {
    pFVar2 = this->options_;
    bVar3 = internal::ExtensionSet::IsInitialized(&pFVar2->_extensions_);
    if (!bVar3) {
      return false;
    }
    bVar3 = internal::AllAreInitialized<google::protobuf::UninterpretedOption>
                      (&pFVar2->uninterpreted_option_);
    if (!bVar3) {
      return false;
    }
  }
  return true;
}

Assistant:

bool FileDescriptorProto::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(message_type_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(enum_type_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(service_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(extension_)) return false;
  if (_internal_has_options()) {
    if (!options_->IsInitialized()) return false;
  }
  return true;
}